

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O1

string * __thiscall
flatbuffers::python::PythonGenerator::NestedFlatbufferType
          (string *__return_storage_ptr__,PythonGenerator *this,string *unqualified_name)

{
  StructDef *pSVar1;
  string local_40;
  
  pSVar1 = Parser::LookupStruct((this->super_BaseGenerator).parser_,unqualified_name);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (pSVar1 == (StructDef *)0x0) {
    Namer::NamespacedType
              (&local_40,&(this->namer_).super_Namer,
               &((this->super_BaseGenerator).parser_)->current_namespace_->components,
               unqualified_name);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pSVar1 = Parser::LookupStruct((this->super_BaseGenerator).parser_,__return_storage_ptr__);
    if (pSVar1 == (StructDef *)0x0) {
      __assert_fail("nested_root",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_python.cpp"
                    ,0x450,
                    "std::string flatbuffers::python::PythonGenerator::NestedFlatbufferType(std::string) const"
                   );
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string NestedFlatbufferType(std::string unqualified_name) const {
    StructDef *nested_root = parser_.LookupStruct(unqualified_name);
    std::string qualified_name;
    if (nested_root == nullptr) {
      qualified_name = namer_.NamespacedType(
          parser_.current_namespace_->components, unqualified_name);
      // Double check qualified name just to be sure it exists.
      nested_root = parser_.LookupStruct(qualified_name);
    }
    FLATBUFFERS_ASSERT(nested_root);  // Guaranteed to exist by parser.
    return qualified_name;
  }